

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  allocator local_359;
  string local_358;
  TutorialApplication local_338;
  
  bVar1 = embree::TutorialBenchmark::benchmark(argc,argv);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              ((TutorialBenchmark *)&local_338,embree::renderBenchFunc<embree::Tutorial>);
    std::__cxx11::string::string((string *)&local_358,"forest",&local_359);
    iVar2 = embree::TutorialBenchmark::main((TutorialBenchmark *)&local_338,argc,argv,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    embree::TutorialBenchmark::~TutorialBenchmark((TutorialBenchmark *)&local_338);
  }
  else {
    embree::Tutorial::Tutorial((Tutorial *)&local_338);
    iVar2 = embree::TutorialApplication::main(&local_338,argc,argv);
    embree::TutorialApplication::~TutorialApplication(&local_338);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "forest");
  }
  return embree::Tutorial().main(argc,argv);
}